

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

char * upb_MtDecoder_BuildMiniTableExtension
                 (upb_MtDecoder *decoder,char *data,size_t len,upb_MiniTableExtension *ext,
                 upb_MiniTable *extendee,upb_MiniTableSub sub)

{
  int iVar1;
  upb_MiniTable *extendee_local;
  upb_MiniTableExtension *ext_local;
  size_t len_local;
  char *data_local;
  upb_MtDecoder *decoder_local;
  upb_MiniTableSub sub_local;
  
  iVar1 = __sigsetjmp((decoder->base).err,0);
  if (iVar1 == 0) {
    sub_local.submsg_dont_copy_me__upb_internal_use_only =
         (upb_MiniTable *)upb_MtDecoder_DoBuildMiniTableExtension(decoder,data,len,ext,extendee,sub)
    ;
  }
  else {
    sub_local.submsg_dont_copy_me__upb_internal_use_only = (upb_MiniTable *)0x0;
  }
  return (char *)sub_local.submsg_dont_copy_me__upb_internal_use_only;
}

Assistant:

static const char* upb_MtDecoder_BuildMiniTableExtension(
    upb_MtDecoder* const decoder, const char* const data, const size_t len,
    upb_MiniTableExtension* const ext, const upb_MiniTable* const extendee,
    const upb_MiniTableSub sub) {
  if (UPB_SETJMP(decoder->base.err) != 0) return NULL;
  return upb_MtDecoder_DoBuildMiniTableExtension(decoder, data, len, ext,
                                                 extendee, sub);
}